

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::iterate(FunctionalTest14_15 *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  ContextInfo *this_00;
  NotSupportedError *this_01;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  ulong uVar7;
  socklen_t __len;
  sockaddr *__addr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  uint local_55c;
  undefined1 local_558 [4];
  GLuint i_1;
  uint local_3d4;
  undefined1 local_3d0 [4];
  GLuint uniform_2;
  uint local_250;
  uint local_24c;
  GLuint i;
  GLuint type_2;
  byte local_c5;
  uint local_c4;
  uint uStack_c0;
  bool result;
  GLuint uniform_1;
  GLuint type_1;
  GLenum binary_format;
  vector<unsigned_char,_std::allocator<unsigned_char>_> program_binary;
  uint local_98;
  GLuint uniform;
  GLuint type;
  bool is_program_binary_supported;
  vertexArray vao;
  buffer transform_feedback_buffer;
  program program;
  string local_40;
  FunctionalTest14_15 *local_10;
  FunctionalTest14_15 *this_local;
  
  local_10 = this;
  if ((iterate()::uni_input == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::uni_input), iVar2 != 0)) {
    Utils::vec4<unsigned_int>::vec4(iterate::uni_input,8,0x40,0x1000,0x1000000);
    Utils::vec4<unsigned_int>::vec4(iterate::uni_input + 1,8,0x40,0x1000,0x1000000);
    __cxa_guard_release(&iterate()::uni_input);
  }
  if ((iterate()::out_routine_1 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::out_routine_1), iVar2 != 0)) {
    Utils::vec4<unsigned_int>::vec4(iterate::out_routine_1,0x1000000,0x1000,0x40,8);
    Utils::vec4<unsigned_int>::vec4(iterate::out_routine_1 + 1,9,0x41,0x1001,0x1000001);
    __cxa_guard_release(&iterate()::out_routine_1);
  }
  if ((iterate()::out_routine_2 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&iterate()::out_routine_2), iVar2 != 0)) {
    Utils::vec4<unsigned_int>::vec4(iterate::out_routine_2,4,0x20,0x800,0x800000);
    Utils::vec4<unsigned_int>::vec4(iterate::out_routine_2 + 1,7,0x3f,0xfff,0xffffff);
    __cxa_guard_release(&iterate()::out_routine_2);
  }
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_shader_subroutine");
  if (bVar1) {
    Utils::program::program
              ((program *)&transform_feedback_buffer.m_context,(this->super_TestCase).m_context);
    Utils::buffer::buffer((buffer *)&vao.m_context,(this->super_TestCase).m_context);
    Utils::vertexArray::vertexArray((vertexArray *)&type,(this->super_TestCase).m_context);
    bVar1 = Utils::program::isProgramBinarySupported
                      ((program *)&transform_feedback_buffer.m_context);
    iVar2 = 0;
    Utils::program::build
              ((program *)&transform_feedback_buffer.m_context,(GLchar *)0x0,(GLchar *)0x0,
               (GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,iterate::vertex_shader_code,
               iterate::varying_names,2,false);
    uVar7 = (ulong)bVar1;
    __len = (socklen_t)bVar1;
    if (bVar1) {
      for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
        GVar3 = Utils::program::getSubroutineIndex
                          ((program *)&transform_feedback_buffer.m_context,
                           iterate::subroutine_names[local_98][0],0x8b31);
        this->m_initial_subroutine_indices[local_98][0] = GVar3;
        GVar3 = Utils::program::getSubroutineIndex
                          ((program *)&transform_feedback_buffer.m_context,
                           iterate::subroutine_names[local_98][1],0x8b31);
        uVar7 = (ulong)local_98;
        this->m_initial_subroutine_indices[uVar7][1] = GVar3;
      }
      for (program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0; __len = (socklen_t)uVar7,
          program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 2;
          program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        GVar3 = Utils::program::getSubroutineUniformLocation
                          ((program *)&transform_feedback_buffer.m_context,
                           iterate::subroutine_uniform_names
                           [program_binary.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_],0x8b31);
        uVar7 = (ulong)program_binary.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_;
        this->m_initial_subroutine_uniform_locations[uVar7] = GVar3;
      }
      pvVar8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(pvVar8);
      Utils::program::getBinary((program *)&transform_feedback_buffer.m_context,pvVar8,&uniform_1);
      Utils::program::remove((program *)&transform_feedback_buffer.m_context,(char *)pvVar8);
      pvVar8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_1;
      Utils::program::createFromBinary
                ((program *)&transform_feedback_buffer.m_context,pvVar8,uniform_1);
      iVar2 = (int)pvVar8;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&type_1);
    }
    Utils::program::use((program *)&transform_feedback_buffer.m_context);
    Utils::vertexArray::generate((vertexArray *)&type);
    Utils::vertexArray::bind((vertexArray *)&type,iVar2,__addr,__len);
    Utils::buffer::generate((buffer *)&vao.m_context);
    Utils::buffer::update((buffer *)&vao.m_context,0x8c8e,0x20,(GLvoid *)0x0,0x88ea);
    Utils::buffer::bindRange((buffer *)&vao.m_context,0x8c8e,0,0,0x20);
    for (uStack_c0 = 0; uStack_c0 < 2; uStack_c0 = uStack_c0 + 1) {
      GVar3 = Utils::program::getSubroutineIndex
                        ((program *)&transform_feedback_buffer.m_context,
                         iterate::subroutine_names[uStack_c0][0],0x8b31);
      this->m_subroutine_indices[uStack_c0][0] = GVar3;
      GVar3 = Utils::program::getSubroutineIndex
                        ((program *)&transform_feedback_buffer.m_context,
                         iterate::subroutine_names[uStack_c0][1],0x8b31);
      this->m_subroutine_indices[uStack_c0][1] = GVar3;
    }
    for (local_c4 = 0; local_c4 < 2; local_c4 = local_c4 + 1) {
      GVar3 = Utils::program::getSubroutineUniformLocation
                        ((program *)&transform_feedback_buffer.m_context,
                         iterate::subroutine_uniform_names[local_c4],0x8b31);
      this->m_subroutine_uniform_locations[local_c4] = GVar3;
    }
    GVar3 = Utils::program::getUniformLocation
                      ((program *)&transform_feedback_buffer.m_context,iterate::uniform_name);
    this->m_uniform_location = GVar3;
    local_c5 = 1;
    if (bVar1) {
      bVar1 = testIndicesAndLocations(this);
      if (!bVar1) {
        pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar5 = tcu::TestContext::getLog(pTVar4);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&i,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&i,
                            (char (*) [66])
                            "Error. Subroutine indices or subroutine uniform location changed.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&i);
        for (local_24c = 0; local_24c < 2; local_24c = local_24c + 1) {
          for (local_250 = 0; local_250 < 2; local_250 = local_250 + 1) {
            pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
            pTVar5 = tcu::TestContext::getLog(pTVar4);
            tcu::TestLog::operator<<
                      ((MessageBuilder *)local_3d0,pTVar5,
                       (BeginMessageToken *)&tcu::TestLog::Message);
            pMVar6 = tcu::MessageBuilder::operator<<
                               ((MessageBuilder *)local_3d0,(char (*) [13])0x2a0b36b);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,iterate::subroutine_names[local_24c] + local_250);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2a17816);
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,this->m_subroutine_indices[local_24c] + local_250);
            pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [17])" initial index: ");
            pMVar6 = tcu::MessageBuilder::operator<<
                               (pMVar6,this->m_initial_subroutine_indices[local_24c] + local_250);
            tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_3d0);
          }
        }
        for (local_3d4 = 0; local_3d4 < 2; local_3d4 = local_3d4 + 1) {
          pTVar4 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar5 = tcu::TestContext::getLog(pTVar4);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_558,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar6 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_558,(char (*) [21])0x2a0b33e);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,iterate::subroutine_uniform_names + local_3d4);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])0x2a0b35d);
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,this->m_subroutine_uniform_locations + local_3d4);
          pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [20])" initial location: ");
          pMVar6 = tcu::MessageBuilder::operator<<
                             (pMVar6,this->m_initial_subroutine_uniform_locations + local_3d4);
          tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_558);
        }
        local_c5 = 0;
      }
      bVar1 = testDefaultSubroutineSet
                        (this,iterate::uni_input,iterate::out_routine_1,iterate::out_routine_2);
      if (!bVar1) {
        local_c5 = 0;
      }
    }
    for (local_55c = 0; local_55c < 2; local_55c = local_55c + 1) {
      uVar7 = (ulong)local_55c;
      bVar1 = testDraw(this,local_55c,iterate::uni_input + uVar7,iterate::out_routine_1 + uVar7,
                       iterate::out_routine_2 + uVar7);
      if (!bVar1) {
        local_c5 = 0;
      }
    }
    if ((local_c5 & 1) == 1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    Utils::vertexArray::~vertexArray((vertexArray *)&type);
    Utils::buffer::~buffer((buffer *)&vao.m_context);
    Utils::program::~program((program *)&transform_feedback_buffer.m_context);
    return STOP;
  }
  program.m_context._6_1_ = 1;
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"GL_ARB_shader_subroutine is not supported.",
             (allocator<char> *)((long)&program.m_context + 7));
  tcu::NotSupportedError::NotSupportedError(this_01,&local_40);
  program.m_context._6_1_ = 0;
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest14_15::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"struct data\n"
		"{\n"
		"    uint r;\n"
		"    uint g;\n"
		"    uint b;\n"
		"    uint a;\n"
		"};\n"
		"\n"
		"subroutine void routine_type_1(in data iparam, out data oparam);\n"
		"subroutine void routine_type_2(inout data arg);\n"
		"\n"
		"subroutine (routine_type_1) void invert(in data iparam, out data oparam)\n"
		"{\n"
		"    oparam.r = iparam.a;\n"
		"    oparam.g = iparam.b;\n"
		"    oparam.b = iparam.g;\n"
		"    oparam.a = iparam.r;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_1) void increment(in data iparam, out data oparam)\n"
		"{\n"
		"    oparam.r = 1 + iparam.r;\n"
		"    oparam.g = 1 + iparam.g;\n"
		"    oparam.b = 1 + iparam.b;\n"
		"    oparam.a = 1 + iparam.a;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_2) void div_by_2(inout data arg)\n"
		"{\n"
		"    arg.r = arg.r / 2;\n"
		"    arg.g = arg.g / 2;\n"
		"    arg.b = arg.b / 2;\n"
		"    arg.a = arg.a / 2;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_2) void decrement(inout data arg)\n"
		"{\n"
		"    arg.r = arg.r - 1;\n"
		"    arg.g = arg.g - 1;\n"
		"    arg.b = arg.b - 1;\n"
		"    arg.a = arg.a - 1;\n"
		"}\n"
		"\n"
		"subroutine uniform routine_type_1 routine_1;\n"
		"subroutine uniform routine_type_2 routine_2;\n"
		"\n"
		"uniform uvec4 uni_input;\n"
		"\n"
		"out uvec4 out_routine_1;\n"
		"out uvec4 out_routine_2;\n"
		"\n"
		"\n"
		"void main()\n"
		"{\n"
		"    data routine_1_input;\n"
		"    data routine_1_output;\n"
		"    data routine_2_arg;\n"
		"\n"
		"    routine_1_input.r = uni_input.r;\n"
		"    routine_1_input.g = uni_input.g;\n"
		"    routine_1_input.b = uni_input.b;\n"
		"    routine_1_input.a = uni_input.a;\n"
		"\n"
		"    routine_2_arg.r = uni_input.r;\n"
		"    routine_2_arg.g = uni_input.g;\n"
		"    routine_2_arg.b = uni_input.b;\n"
		"    routine_2_arg.a = uni_input.a;\n"
		"\n"
		"    routine_1(routine_1_input, routine_1_output);\n"
		"    routine_2(routine_2_arg);\n"
		"\n"
		"    out_routine_1.r = routine_1_output.r;\n"
		"    out_routine_1.g = routine_1_output.g;\n"
		"    out_routine_1.b = routine_1_output.b;\n"
		"    out_routine_1.a = routine_1_output.a;\n"
		"\n"
		"    out_routine_2.r = routine_2_arg.r;\n"
		"    out_routine_2.g = routine_2_arg.g;\n"
		"    out_routine_2.b = routine_2_arg.b;\n"
		"    out_routine_2.a = routine_2_arg.a;\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[][2] = { { "invert", "increment" }, { "div_by_2", "decrement" } };
	static const GLuint  n_subroutine_types	= sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "routine_1", "routine_2" };
	static const GLuint  n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_name	= "uni_input";
	static const GLchar* varying_names[] = { "out_routine_1", "out_routine_2" };

	static const GLuint n_varying_names				   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varying_names * 4 * sizeof(GLuint);

	/* Test data */
	static const Utils::vec4<GLuint> uni_input[] = { Utils::vec4<GLuint>(8, 64, 4096, 16777216),
													 Utils::vec4<GLuint>(8, 64, 4096, 16777216) };

	static const Utils::vec4<GLuint> out_routine_1[] = { Utils::vec4<GLuint>(16777216, 4096, 64, 8),
														 Utils::vec4<GLuint>(9, 65, 4097, 16777217) };

	static const Utils::vec4<GLuint> out_routine_2[] = { Utils::vec4<GLuint>(4, 32, 2048, 8388608),
														 Utils::vec4<GLuint>(7, 63, 4095, 16777215) };

	static const GLuint n_test_cases = 2;

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	bool is_program_binary_supported = program.isProgramBinarySupported();

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code,
				  varying_names /* varying_names */, n_varying_names /* n_varyings */);

	/* Do not execute the test if GL_ARB_get_program_binary is not supported */
	if (true == is_program_binary_supported)
	{
		/* Get subroutine indices */
		for (GLuint type = 0; type < n_subroutine_types; ++type)
		{
			m_initial_subroutine_indices[type][0] =
				program.getSubroutineIndex(subroutine_names[type][0], GL_VERTEX_SHADER);

			m_initial_subroutine_indices[type][1] =
				program.getSubroutineIndex(subroutine_names[type][1], GL_VERTEX_SHADER);
		}

		/* Get subroutine uniform locations */
		for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
		{
			m_initial_subroutine_uniform_locations[uniform] =
				program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
		}

		/* Delete program and recreate it from binary */
		std::vector<GLubyte> program_binary;
		GLenum				 binary_format;

		program.getBinary(program_binary, binary_format);
		program.remove();
		program.createFromBinary(program_binary, binary_format);
	}

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		m_subroutine_indices[type][0] = program.getSubroutineIndex(subroutine_names[type][0], GL_VERTEX_SHADER);
		m_subroutine_indices[type][1] = program.getSubroutineIndex(subroutine_names[type][1], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Get uniform locations */
	m_uniform_location = program.getUniformLocation(uniform_name);

	/* Test */
	bool result = true;

	/* Test program binary */
	if (true == is_program_binary_supported)
	{
		/* Test indices and locations */
		if (false == testIndicesAndLocations())
		{
			static const GLuint n_subroutines_per_type = 2;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Subroutine indices or subroutine uniform location changed."
												<< tcu::TestLog::EndMessage;

			for (GLuint type = 0; type < n_subroutine_types; ++type)
			{
				for (GLuint i = 0; i < n_subroutines_per_type; ++i)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Subroutine: " << subroutine_names[type][i]
						<< " index: " << m_subroutine_indices[type][i]
						<< " initial index: " << m_initial_subroutine_indices[type][i] << tcu::TestLog::EndMessage;
				}
			}

			for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Subroutine uniform: " << subroutine_uniform_names[uniform]
					<< " location: " << m_subroutine_uniform_locations[uniform]
					<< " initial location: " << m_initial_subroutine_uniform_locations[uniform]
					<< tcu::TestLog::EndMessage;
			}

			result = false;
		}

		/* Test draw with deafult set of subroutines */
		if (false == testDefaultSubroutineSet(uni_input[0], out_routine_1, out_routine_2))
		{
			result = false;
		}
	}

	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		if (false == testDraw(i, uni_input[i], out_routine_1[i], out_routine_2[i]))
		{
			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}